

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_screens.cpp
# Opt level: O1

void __thiscall QXcbConnection::destroyScreen(QXcbConnection *this,QXcbScreen *screen)

{
  int *piVar1;
  long lVar2;
  QXcbVirtualDesktop *pQVar3;
  QArrayData *pQVar4;
  QPlatformScreen **ppQVar5;
  QPlatformScreen *pQVar6;
  QTextStream *this_00;
  QDebug QVar7;
  QLoggingCategory *pQVar8;
  uint uVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  undefined1 local_b0 [48];
  QDebug local_80;
  QTextStream *local_78;
  undefined1 local_70 [8];
  QDebug local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QXcbVirtualDesktop *local_58;
  QXcbScreen *local_50;
  QString local_48;
  uint *local_30;
  
  local_30 = *(uint **)(in_FS_OFFSET + 0x28);
  pQVar3 = screen->m_virtualDesktop;
  pQVar4 = &((pQVar3->m_screens).d.d)->super_QArrayData;
  lVar10 = (pQVar3->m_screens).d.size;
  local_50 = screen;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
  if (lVar10 == 1) {
    local_58 = (QXcbVirtualDesktop *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.stream._0_4_ = 0xaaaaaaaa;
    local_68.stream._4_4_ = 0xaaaaaaaa;
    uStack_60._0_1_ = (QXcbScreen)0xaa;
    uStack_60._1_3_ = 0xaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    (**(code **)(*(long *)local_50 + 0x90))();
    QXcbScreen::setOutput((QXcbScreen *)local_50,0,(xcb_randr_get_output_info_reply_t *)0x0);
    pQVar8 = QtPrivateLogging::lcQpaScreen();
    if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_b0._40_8_ = pQVar8->name;
      local_b0._16_4_ = 2;
      local_b0._20_4_ = 0;
      local_b0._24_4_ = 0;
      local_b0._28_8_ = 0;
      local_b0._36_4_ = 0;
      QMessageLogger::debug();
      QVar7.stream = local_80.stream;
      QVar13.m_data = (storage_type *)0xb;
      QVar13.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      puVar11 = (undefined8 *)CONCAT44(uStack_5c,uStack_60);
      if (puVar11 == (undefined8 *)0x0) {
        puVar11 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_80,(ulong)puVar11);
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QVar7.stream = local_80.stream;
      QVar14.m_data = (storage_type *)0x7;
      QVar14.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      local_78 = (QTextStream *)local_80.stream;
      *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
      ::operator<<((Stream *)local_70,(QXcbScreen *)&local_78);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug((QDebug *)&local_78);
      QDebug::~QDebug(&local_80);
    }
    piVar1 = (int *)CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_),2,0x10);
      }
    }
    goto LAB_00145a88;
  }
  QtPrivate::sequential_erase_one<QList<QXcbScreen*>,QXcbScreen*>
            ((QList<QXcbScreen_*> *)(this + 0x338),&local_50);
  local_b0._16_4_ = SUB84(local_50,0);
  local_b0._20_4_ = (undefined4)((ulong)local_50 >> 0x20);
  QtPrivate::sequential_erase_one<QList<QPlatformScreen*>,QPlatformScreen*>
            (&pQVar3->m_screens,(QPlatformScreen **)(local_b0 + 0x10));
  if (local_50->m_primary == true) {
    pQVar4 = &((pQVar3->m_screens).d.d)->super_QArrayData;
    ppQVar5 = (pQVar3->m_screens).d.ptr;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar6 = *ppQVar5;
    lVar10 = extraout_RDX;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,8,0x10);
        lVar10 = extraout_RDX_00;
      }
    }
    pQVar6[0x3c] = (QPlatformScreen)0x1;
    if (*(long *)(this + 0x348) == 0) {
LAB_0014597f:
      uVar9 = 0xffffffff;
    }
    else {
      lVar12 = -8;
      do {
        uVar9 = (uint)lVar10;
        lVar2 = *(long *)(this + 0x348) * -8 + lVar12;
        if (lVar2 == -8) goto LAB_00145979;
        lVar10 = lVar12 + 8;
        puVar11 = (undefined8 *)(*(long *)(this + 0x340) + 8 + lVar12);
        lVar12 = lVar10;
      } while ((QPlatformScreen *)*puVar11 != pQVar6);
      uVar9 = (uint)(lVar10 >> 3);
LAB_00145979:
      if (lVar2 == -8) goto LAB_0014597f;
    }
    if (0 < (int)uVar9) {
      QList<QXcbScreen_*>::swapItemsAt
                ((QList<QXcbScreen_*> *)(this + 0x338),0,(ulong)(uVar9 & 0x7fffffff));
    }
    QWindowSystemInterface::handlePrimaryScreenChanged(pQVar6);
  }
  pQVar8 = QtPrivateLogging::lcQpaScreen();
  if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_b0._40_8_ = pQVar8->name;
    local_b0._16_4_ = 2;
    local_b0._20_4_ = 0;
    local_b0._24_4_ = 0;
    local_b0._28_8_ = 0;
    local_b0._36_4_ = 0;
    QMessageLogger::debug();
    this_00 = (QTextStream *)CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_);
    QVar15.m_data = (storage_type *)0x16;
    QVar15.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(this_00,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (((QTextStream *)CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_))[0x30] ==
        (QTextStream)0x1) {
      QTextStream::operator<<
                ((QTextStream *)CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_),' ');
    }
    piVar1 = (int *)(CONCAT44(local_68.stream._4_4_,local_68.stream._0_4_) + 0x28);
    *piVar1 = *piVar1 + 1;
    ::operator<<((Stream *)(local_b0 + 8),(QXcbScreen *)local_b0);
    QDebug::~QDebug((QDebug *)(local_b0 + 8));
    QDebug::~QDebug((QDebug *)local_b0);
    QDebug::~QDebug(&local_68);
  }
  QWindowSystemInterface::handleScreenRemoved(&local_50->super_QPlatformScreen);
LAB_00145a88:
  if (*(uint **)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbConnection::destroyScreen(QXcbScreen *screen)
{
    QXcbVirtualDesktop *virtualDesktop = screen->virtualDesktop();
    if (virtualDesktop->screens().size() == 1) {
        // If there are no other screens on the same virtual desktop,
        // then transform the physical screen into a fake screen.
        const QString nameWas = screen->name();
        screen->setOutput(XCB_NONE, nullptr);
        qCDebug(lcQpaScreen) << "transformed" << nameWas << "to fake" << screen;
    } else {
        // There is more than one screen on the same virtual desktop, remove the screen
        m_screens.removeOne(screen);
        virtualDesktop->removeScreen(screen);

        // When primary screen is removed, set the new primary screen
        // which belongs to the primary virtual desktop.
        if (screen->isPrimary()) {
            QXcbScreen *newPrimary = static_cast<QXcbScreen *>(virtualDesktop->screens().at(0));
            newPrimary->setPrimary(true);
            const int idx = m_screens.indexOf(newPrimary);
            if (idx > 0)
                m_screens.swapItemsAt(0, idx);
            QWindowSystemInterface::handlePrimaryScreenChanged(newPrimary);
        }

        qCDebug(lcQpaScreen) << "destroyScreen: destroy" << screen;
        QWindowSystemInterface::handleScreenRemoved(screen);
    }
}